

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O0

PyObject * libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)

{
  xmlNodePtr node_00;
  int *piVar1;
  PyObject *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  PyObject *pyobj;
  xmlXPathObjectPtr setobj;
  PyObject *list_2;
  int i_2;
  xmlLocationSetPtr set;
  PyObject *list_1;
  PyObject *tuple_2;
  PyObject *indexIntoNode_2;
  PyObject *node_4;
  PyObject *list;
  PyObject *tuple_1;
  PyObject *indexIntoNode_1;
  PyObject *node_3;
  unsigned_short bCollapsedRange;
  PyObject *tuple;
  PyObject *indexIntoNode;
  PyObject *node_2;
  PyObject *ns;
  xmlNodePtr node_1;
  _xmlNode *p_Stack_30;
  int i_1;
  xmlNodePtr node;
  int len;
  int i;
  PyObject *ret;
  xmlXPathObjectPtr obj_local;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    obj_local = (xmlXPathObjectPtr)&_Py_NoneStruct;
  }
  else {
    switch(obj->type) {
    case XPATH_NODESET:
      if ((obj->nodesetval == (xmlNodeSetPtr)0x0) || (obj->nodesetval->nodeNr == 0)) {
        _len = (xmlXPathObjectPtr)PyList_New(0);
      }
      else {
        _len = (xmlXPathObjectPtr)PyList_New((long)obj->nodesetval->nodeNr);
        for (node_1._4_4_ = 0; node_1._4_4_ < obj->nodesetval->nodeNr;
            node_1._4_4_ = node_1._4_4_ + 1) {
          node_00 = obj->nodesetval->nodeTab[node_1._4_4_];
          if (node_00->type == XML_NAMESPACE_DECL) {
            uVar3 = PyCapsule_New(node_00,"xmlNsPtr",libxml_xmlXPathDestructNsNode);
            PyList_SetItem(_len,(long)node_1._4_4_,uVar3);
            obj->nodesetval->nodeTab[node_1._4_4_] = (xmlNodePtr)0x0;
          }
          else {
            pPVar2 = libxml_xmlNodePtrWrap(node_00);
            PyList_SetItem(_len,(long)node_1._4_4_,pPVar2);
          }
        }
      }
      break;
    case XPATH_BOOLEAN:
      _len = (xmlXPathObjectPtr)PyLong_FromLong((long)obj->boolval);
      break;
    case XPATH_NUMBER:
      _len = (xmlXPathObjectPtr)PyFloat_FromDouble(obj->floatval);
      break;
    case XPATH_STRING:
      _len = (xmlXPathObjectPtr)PyUnicode_FromString(obj->stringval);
      break;
    case XPATH_POINT:
      pPVar2 = libxml_xmlNodePtrWrap((xmlNodePtr)obj->user);
      uVar3 = PyLong_FromLong((long)obj->index);
      _len = (xmlXPathObjectPtr)PyTuple_New(2);
      PyTuple_SetItem(_len,0,pPVar2);
      PyTuple_SetItem(_len,1,uVar3);
      break;
    case XPATH_RANGE:
      bVar5 = true;
      if ((obj->user2 != (void *)0x0) && (bVar5 = false, obj->user2 == obj->user)) {
        bVar5 = obj->index == obj->index2;
      }
      if (bVar5) {
        _len = (xmlXPathObjectPtr)PyList_New(1);
        pPVar2 = libxml_xmlNodePtrWrap((xmlNodePtr)obj->user);
        uVar3 = PyLong_FromLong((long)obj->index);
        uVar4 = PyTuple_New(2);
        PyTuple_SetItem(uVar4,0,pPVar2);
        PyTuple_SetItem(uVar4,1,uVar3);
        PyList_SetItem(_len,0,uVar4);
      }
      else {
        _len = (xmlXPathObjectPtr)PyList_New(2);
        pPVar2 = libxml_xmlNodePtrWrap((xmlNodePtr)obj->user);
        uVar3 = PyLong_FromLong((long)obj->index);
        uVar4 = PyTuple_New(2);
        PyTuple_SetItem(uVar4,0,pPVar2);
        PyTuple_SetItem(uVar4,1,uVar3);
        PyList_SetItem(_len,0,uVar4);
        pPVar2 = libxml_xmlNodePtrWrap((xmlNodePtr)obj->user2);
        uVar3 = PyLong_FromLong((long)obj->index2);
        uVar4 = PyTuple_New(2);
        PyTuple_SetItem(uVar4,0,pPVar2);
        PyTuple_SetItem(uVar4,1,uVar3);
        PyList_SetItem(_len,1,uVar4);
      }
      break;
    case XPATH_LOCATIONSET:
      piVar1 = (int *)obj->user;
      if ((piVar1 == (int *)0x0) || (*piVar1 < 1)) {
        _Py_INCREF((PyObject *)&_Py_NoneStruct);
        _len = (xmlXPathObjectPtr)&_Py_NoneStruct;
      }
      else {
        _len = (xmlXPathObjectPtr)PyList_New((long)*piVar1);
        for (list_2._4_4_ = 0; list_2._4_4_ < *piVar1; list_2._4_4_ = list_2._4_4_ + 1) {
          pPVar2 = libxml_xmlXPathObjectPtrWrap
                             (*(xmlXPathObjectPtr *)(*(long *)(piVar1 + 2) + (long)list_2._4_4_ * 8)
                             );
          *(undefined8 *)(*(long *)(piVar1 + 2) + (long)list_2._4_4_ * 8) = 0;
          PyList_SetItem(_len,(long)list_2._4_4_,pPVar2);
        }
        *piVar1 = 0;
      }
      break;
    default:
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      _len = (xmlXPathObjectPtr)&_Py_NoneStruct;
      break;
    case XPATH_XSLT_TREE:
      if (((obj->nodesetval == (xmlNodeSetPtr)0x0) || (obj->nodesetval->nodeNr == 0)) ||
         (obj->nodesetval->nodeTab == (xmlNodePtr *)0x0)) {
        _len = (xmlXPathObjectPtr)PyList_New(0);
      }
      else {
        node._0_4_ = 0;
        for (p_Stack_30 = (*obj->nodesetval->nodeTab)->children; p_Stack_30 != (_xmlNode *)0x0;
            p_Stack_30 = p_Stack_30->next) {
          node._0_4_ = (int)node + 1;
        }
        _len = (xmlXPathObjectPtr)PyList_New((long)(int)node);
        p_Stack_30 = (*obj->nodesetval->nodeTab)->children;
        for (node._4_4_ = 0; node._4_4_ < (int)node; node._4_4_ = node._4_4_ + 1) {
          pPVar2 = libxml_xmlNodePtrWrap(p_Stack_30);
          PyList_SetItem(_len,(long)node._4_4_,pPVar2);
          p_Stack_30 = p_Stack_30->next;
        }
      }
      return (PyObject *)_len;
    }
    xmlXPathFreeObject(obj);
    obj_local = _len;
  }
  return (PyObject *)obj_local;
}

Assistant:

PyObject *
libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlXPathObjectPtrWrap: ctxt = %p\n", obj);
#endif
    if (obj == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    switch (obj->type) {
        case XPATH_XSLT_TREE: {
            if ((obj->nodesetval == NULL) ||
		(obj->nodesetval->nodeNr == 0) ||
		(obj->nodesetval->nodeTab == NULL)) {
                ret = PyList_New(0);
	    } else {
		int i, len = 0;
		xmlNodePtr node;

		node = obj->nodesetval->nodeTab[0]->children;
		while (node != NULL) {
		    len++;
		    node = node->next;
		}
		ret = PyList_New(len);
		node = obj->nodesetval->nodeTab[0]->children;
		for (i = 0;i < len;i++) {
                    PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    node = node->next;
		}
	    }
	    /*
	     * Return now, do not free the object passed down
	     */
	    return (ret);
	}
        case XPATH_NODESET:
            if ((obj->nodesetval == NULL)
                || (obj->nodesetval->nodeNr == 0)) {
                ret = PyList_New(0);
	    } else {
                int i;
                xmlNodePtr node;

                ret = PyList_New(obj->nodesetval->nodeNr);
                for (i = 0; i < obj->nodesetval->nodeNr; i++) {
                    node = obj->nodesetval->nodeTab[i];
                    if (node->type == XML_NAMESPACE_DECL) {
		        PyObject *ns = PyCapsule_New((void *) node,
                                     (char *) "xmlNsPtr",
				     libxml_xmlXPathDestructNsNode);
			PyList_SetItem(ret, i, ns);
			/* make sure the xmlNsPtr is not destroyed now */
			obj->nodesetval->nodeTab[i] = NULL;
		    } else {
			PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    }
                }
            }
            break;
        case XPATH_BOOLEAN:
            ret = PY_IMPORT_INT((long) obj->boolval);
            break;
        case XPATH_NUMBER:
            ret = PyFloat_FromDouble(obj->floatval);
            break;
        case XPATH_STRING:
	    ret = PY_IMPORT_STRING((char *) obj->stringval);
            break;
        case XPATH_POINT:
        {
            PyObject *node;
            PyObject *indexIntoNode;
            PyObject *tuple;

            node = libxml_xmlNodePtrWrap(obj->user);
            indexIntoNode = PY_IMPORT_INT((long) obj->index);

            tuple = PyTuple_New(2);
            PyTuple_SetItem(tuple, 0, node);
            PyTuple_SetItem(tuple, 1, indexIntoNode);

            ret = tuple;
            break;
        }
        case XPATH_RANGE:
        {
            unsigned short bCollapsedRange;

            bCollapsedRange = ( (obj->user2 == NULL) ||
		                ((obj->user2 == obj->user) && (obj->index == obj->index2)) );
            if ( bCollapsedRange ) {
                PyObject *node;
                PyObject *indexIntoNode;
                PyObject *tuple;
                PyObject *list;

                list = PyList_New(1);

                node = libxml_xmlNodePtrWrap(obj->user);
                indexIntoNode = PY_IMPORT_INT((long) obj->index);

                tuple = PyTuple_New(2);
                PyTuple_SetItem(tuple, 0, node);
                PyTuple_SetItem(tuple, 1, indexIntoNode);

                PyList_SetItem(list, 0, tuple);

                ret = list;
            } else {
                PyObject *node;
                PyObject *indexIntoNode;
                PyObject *tuple;
                PyObject *list;

                list = PyList_New(2);

                node = libxml_xmlNodePtrWrap(obj->user);
                indexIntoNode = PY_IMPORT_INT((long) obj->index);

                tuple = PyTuple_New(2);
                PyTuple_SetItem(tuple, 0, node);
                PyTuple_SetItem(tuple, 1, indexIntoNode);

                PyList_SetItem(list, 0, tuple);

                node = libxml_xmlNodePtrWrap(obj->user2);
                indexIntoNode = PY_IMPORT_INT((long) obj->index2);

                tuple = PyTuple_New(2);
                PyTuple_SetItem(tuple, 0, node);
                PyTuple_SetItem(tuple, 1, indexIntoNode);

                PyList_SetItem(list, 1, tuple);

                ret = list;
            }
            break;
        }
        case XPATH_LOCATIONSET:
        {
            xmlLocationSetPtr set;

            set = obj->user;
            if ( set && set->locNr > 0 ) {
                int i;
                PyObject *list;

                list = PyList_New(set->locNr);

                for (i=0; i<set->locNr; i++) {
                    xmlXPathObjectPtr setobj;
                    PyObject *pyobj;

                    setobj = set->locTab[i]; /*xmlXPathObjectPtr setobj*/

                    pyobj = libxml_xmlXPathObjectPtrWrap(setobj);
                    /* xmlXPathFreeObject(setobj) is called */
                    set->locTab[i] = NULL;

                    PyList_SetItem(list, i, pyobj);
                }
                set->locNr = 0;
                ret = list;
            } else {
                Py_INCREF(Py_None);
                ret = Py_None;
            }
            break;
        }
        default:
#ifdef DEBUG
            printf("Unable to convert XPath object type %d\n", obj->type);
#endif
            Py_INCREF(Py_None);
            ret = Py_None;
    }
    xmlXPathFreeObject(obj);
    return (ret);
}